

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  OutPt **ppOVar1;
  IntPoint *pIVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  IntPoint *pIVar7;
  byte bVar8;
  OutPt *pOVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  lVar3 = (btmPt1->Pt).X;
  lVar4 = (btmPt1->Pt).Y;
  pOVar9 = btmPt1;
  do {
    pOVar9 = pOVar9->Prev;
    lVar5 = (pOVar9->Pt).X;
    lVar10 = (pOVar9->Pt).Y;
    if ((pOVar9 == btmPt1) || (lVar5 != lVar3)) break;
  } while (lVar10 == lVar4);
  lVar10 = lVar10 - lVar4;
  pOVar9 = btmPt1;
  if (lVar10 == 0) {
    dVar11 = -1e+40;
  }
  else {
    dVar11 = (double)(lVar5 - lVar3) / (double)lVar10;
  }
  do {
    pOVar9 = pOVar9->Next;
    lVar5 = (pOVar9->Pt).X;
    lVar10 = (pOVar9->Pt).Y;
    if ((pOVar9 == btmPt1) || (lVar5 != lVar3)) break;
  } while (lVar10 == lVar4);
  dVar11 = ABS(dVar11);
  lVar10 = lVar10 - lVar4;
  if (lVar10 == 0) {
    dVar12 = -1e+40;
  }
  else {
    dVar12 = (double)(lVar5 - lVar3) / (double)lVar10;
  }
  lVar3 = (btmPt2->Pt).X;
  lVar4 = (btmPt2->Pt).Y;
  pOVar9 = btmPt2;
  do {
    pOVar9 = pOVar9->Prev;
    lVar5 = (pOVar9->Pt).X;
    lVar10 = (pOVar9->Pt).Y;
    if ((pOVar9 == btmPt2) || (lVar5 != lVar3)) break;
  } while (lVar10 == lVar4);
  dVar12 = ABS(dVar12);
  lVar10 = lVar10 - lVar4;
  pOVar9 = btmPt2;
  if (lVar10 == 0) {
    dVar6 = -1e+40;
  }
  else {
    dVar6 = (double)(lVar5 - lVar3) / (double)lVar10;
  }
  do {
    pOVar9 = pOVar9->Next;
    lVar5 = (pOVar9->Pt).X;
    lVar10 = (pOVar9->Pt).Y;
    if ((pOVar9 == btmPt2) || (lVar5 != lVar3)) break;
  } while (lVar10 == lVar4);
  dVar6 = ABS(dVar6);
  lVar10 = lVar10 - lVar4;
  if (lVar10 == 0) {
    dVar13 = -1e+40;
  }
  else {
    dVar13 = (double)(lVar5 - lVar3) / (double)lVar10;
  }
  dVar13 = ABS(dVar13);
  dVar14 = dVar12;
  if (dVar12 <= dVar11) {
    dVar14 = dVar11;
  }
  dVar15 = dVar13;
  if (dVar13 <= dVar6) {
    dVar15 = dVar6;
  }
  if ((dVar14 == dVar15) && (!NAN(dVar14) && !NAN(dVar15))) {
    dVar14 = dVar12;
    if (dVar11 <= dVar12) {
      dVar14 = dVar11;
    }
    dVar15 = dVar13;
    if (dVar6 <= dVar13) {
      dVar15 = dVar6;
    }
    if ((dVar14 == dVar15) && (!NAN(dVar14) && !NAN(dVar15))) {
      if (btmPt1 == (OutPt *)0x0) {
        bVar8 = 0;
      }
      else {
        dVar11 = 0.0;
        pOVar9 = btmPt1;
        do {
          ppOVar1 = &pOVar9->Prev;
          pIVar7 = &pOVar9->Pt;
          pIVar2 = &pOVar9->Pt;
          pOVar9 = pOVar9->Next;
          dVar11 = dVar11 + (double)(((*ppOVar1)->Pt).Y - pIVar7->Y) *
                            (double)(pIVar2->X + ((*ppOVar1)->Pt).X);
        } while (pOVar9 != btmPt1);
        bVar8 = 0.0 < dVar11 * 0.5;
      }
      goto LAB_0028f154;
    }
  }
  if ((dVar11 < dVar6) || (bVar8 = 1, dVar11 < dVar13)) {
    bVar8 = -(dVar13 <= dVar12 && dVar6 <= dVar12);
  }
LAB_0028f154:
  return (bool)(bVar8 & 1);
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->Prev;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Prev;
  double dx1p = std::fabs(GetDx(btmPt1->Pt, p->Pt));
  p = btmPt1->Next;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Next;
  double dx1n = std::fabs(GetDx(btmPt1->Pt, p->Pt));

  p = btmPt2->Prev;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Prev;
  double dx2p = std::fabs(GetDx(btmPt2->Pt, p->Pt));
  p = btmPt2->Next;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Next;
  double dx2n = std::fabs(GetDx(btmPt2->Pt, p->Pt));

  if (std::max(dx1p, dx1n) == std::max(dx2p, dx2n) &&
    std::min(dx1p, dx1n) == std::min(dx2p, dx2n))
      return Area(btmPt1) > 0; //if otherwise identical use orientation
  else
    return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}